

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Refal2::CParser::parsingInitial(CParser *this)

{
  allocator local_31;
  string local_30 [32];
  CParser *local_10;
  CParser *this_local;
  
  local_10 = this;
  if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type == TT_None)
  {
    __assert_fail("token.type != TT_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Parser.cpp"
                  ,0x1d,"void Refal2::CParser::parsingInitial()");
  }
  if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type == TT_Word)
  {
    CRuleParser::EndFunction((CRuleParser *)this);
    CToken::Move(&(this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token,
                 &this->savedToken1);
    this->state = (TState)parsingWord;
    *(undefined8 *)&this->field_0x1f68 = 0;
  }
  else if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type ==
           TT_Blank) {
    this->state = (TState)parsingBlank;
    *(undefined8 *)&this->field_0x1f68 = 0;
  }
  else if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type !=
           TT_LineFeed) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"line should begin with word or space",&local_31);
    error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    this->state = (TState)parsingIgnoreLine;
    *(undefined8 *)&this->field_0x1f68 = 0;
  }
  return;
}

Assistant:

void CParser::parsingInitial()
{
	assert( token.type != TT_None );
	if( token.type == TT_Word ) {
		CRuleParser::EndFunction(); // action
		token.Move( savedToken1 );
		state = &CParser::parsingWord;
	} else if( token.type == TT_Blank ) {
		state = &CParser::parsingBlank;
	} else if( token.type != TT_LineFeed ) {
		error( "line should begin with word or space" );
		state = &CParser::parsingIgnoreLine;
	}
}